

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

int deqp::gles31::Functional::anon_unknown_1::referencePrimitiveCount
              (TessPrimitiveType primitiveType,SpacingMode spacingMode,bool usePointMode,
              float *innerLevels,float *outerLevels)

{
  undefined4 local_2c;
  float *outerLevels_local;
  float *innerLevels_local;
  bool usePointMode_local;
  SpacingMode spacingMode_local;
  TessPrimitiveType primitiveType_local;
  
  if (usePointMode) {
    local_2c = referencePointModePrimitiveCount(primitiveType,spacingMode,innerLevels,outerLevels);
  }
  else {
    local_2c = referenceNonPointModePrimitiveCount
                         (primitiveType,spacingMode,innerLevels,outerLevels);
  }
  return local_2c;
}

Assistant:

static int referencePrimitiveCount (TessPrimitiveType primitiveType, SpacingMode spacingMode, bool usePointMode, const float* innerLevels, const float* outerLevels)
{
	return usePointMode ? referencePointModePrimitiveCount		(primitiveType, spacingMode, innerLevels, outerLevels)
						: referenceNonPointModePrimitiveCount	(primitiveType, spacingMode, innerLevels, outerLevels);
}